

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_HPKE_Curve51_CP256_SHA256.c
# Opt level: O2

uint32_t Hacl_HPKE_Curve51_CP256_SHA256_setupBaseS
                   (uint8_t *o_pkE,Hacl_Impl_HPKE_context_s o_ctx,uint8_t *skE,uint8_t *pkR,
                   uint32_t infolen,uint8_t *info)

{
  uint8_t *prk;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  byte bVar9;
  uint ikmlen;
  uint32_t infolen_00;
  uint8_t *puVar10;
  uint32_t i;
  long lVar11;
  uint8_t *puVar12;
  uint32_t saltlen;
  byte bVar13;
  ulong uVar14;
  undefined8 uStack_2a0;
  uint8_t auStack_298 [6];
  undefined2 uStack_292;
  undefined1 uStack_290;
  undefined8 uStack_28f;
  undefined2 uStack_287;
  undefined8 uStack_285;
  undefined2 uStack_27d;
  uint8_t auStack_27b [9];
  uint8_t auStack_272 [8];
  uint8_t auStack_26a [8];
  uint8_t auStack_262 [8];
  undefined8 uStack_25a;
  uint8_t auStack_252 [8];
  uint8_t auStack_24a [8];
  uint8_t auStack_242 [10];
  uint8_t auStack_238 [6];
  undefined2 uStack_232;
  undefined1 uStack_230;
  undefined8 uStack_22f;
  undefined2 uStack_227;
  uint8_t auStack_225 [4];
  uint8_t auStack_221 [8];
  uint8_t auStack_219 [8];
  uint8_t auStack_211 [8];
  uint8_t auStack_209 [8];
  undefined8 uStack_201;
  uint8_t auStack_1f9 [8];
  uint8_t auStack_1f1 [8];
  uint8_t auStack_1e9 [9];
  undefined8 uStack_1e0;
  uint8_t local_1d8 [2];
  undefined4 local_1d6;
  undefined2 local_1d2;
  undefined1 local_1d0;
  undefined4 local_1cf;
  undefined1 local_1cb;
  undefined1 local_1ca [5];
  undefined8 uStack_1c5;
  undefined8 local_1bd;
  undefined8 uStack_1b5;
  undefined8 uStack_1ad;
  undefined1 auStack_1a5 [8];
  undefined8 local_19d;
  undefined8 uStack_195;
  undefined8 uStack_18d;
  undefined5 uStack_185;
  undefined3 uStack_180;
  undefined5 uStack_17d;
  uint8_t local_178 [4];
  undefined2 local_174;
  undefined1 local_172;
  undefined4 local_171;
  undefined1 local_16d;
  undefined1 local_16c [4];
  undefined1 auStack_168 [3];
  undefined1 local_165 [5];
  undefined3 uStack_160;
  undefined5 uStack_15d;
  undefined4 uStack_158;
  undefined2 uStack_154;
  undefined1 uStack_152;
  undefined4 uStack_151;
  undefined4 uStack_14d;
  undefined2 uStack_149;
  undefined1 auStack_147 [8];
  undefined1 auStack_13f [3];
  undefined4 uStack_13c;
  undefined8 uStack_138;
  uint8_t o_info_hash [32];
  uint8_t o_shared [32];
  uint8_t o_eae_prk [32];
  uint8_t zeros [32];
  undefined1 auStack_78 [8];
  uint8_t o_dh [32];
  undefined8 local_40;
  undefined2 local_38;
  
  o_info_hash[0x18] = '\0';
  o_info_hash[0x19] = '\0';
  o_info_hash[0x1a] = '\0';
  o_info_hash[0x1b] = '\0';
  o_info_hash[0x1c] = '\0';
  o_info_hash[0x1d] = '\0';
  o_info_hash[0x1e] = '\0';
  o_info_hash[0x1f] = '\0';
  o_shared[0] = '\0';
  o_shared[1] = '\0';
  o_shared[2] = '\0';
  o_shared[3] = '\0';
  o_shared[4] = '\0';
  o_shared[5] = '\0';
  o_shared[6] = '\0';
  o_shared[7] = '\0';
  o_shared[8] = '\0';
  o_shared[9] = '\0';
  o_shared[10] = '\0';
  o_shared[0xb] = '\0';
  o_shared[0xc] = '\0';
  o_shared[0xd] = '\0';
  o_shared[0xe] = '\0';
  o_shared[0xf] = '\0';
  o_shared[0x10] = '\0';
  o_shared[0x11] = '\0';
  o_shared[0x12] = '\0';
  o_shared[0x13] = '\0';
  o_shared[0x14] = '\0';
  o_shared[0x15] = '\0';
  o_shared[0x16] = '\0';
  o_shared[0x17] = '\0';
  stack0xfffffffffffffec0 = 0x1ae7a1;
  uStack_13c = 0;
  o_dh._24_8_ = info;
  Hacl_Curve25519_51_secret_to_public(o_pkE,skE);
  register0x00001200 = ZEXT1632(ZEXT816(0) << 0x40);
  stack0xfffffffffffffec0 = 0x1ae7c3;
  uStack_13c = 0;
  _auStack_78 = register0x00001200;
  Hacl_Curve25519_51_scalarmult(auStack_78,skE,pkR);
  bVar13 = 0xff;
  for (lVar11 = 0; lVar11 != 0x20; lVar11 = lVar11 + 1) {
    stack0xfffffffffffffec0 = 0x1ae7e3;
    uStack_13c = 0;
    bVar9 = FStar_UInt8_eq_mask(auStack_78[lVar11],o_eae_prk[lVar11 + 0x18]);
    bVar13 = bVar13 & bVar9;
  }
  if (bVar13 != 0xff) {
    uVar1 = *(undefined8 *)o_pkE;
    uVar2 = *(undefined8 *)(o_pkE + 8);
    uVar3 = *(undefined8 *)(o_pkE + 0x10);
    uVar4 = *(undefined8 *)(o_pkE + 0x18);
    uVar5 = *(undefined8 *)pkR;
    uVar6 = *(undefined8 *)(pkR + 8);
    uVar7 = *(undefined8 *)(pkR + 0x10);
    uVar8 = *(undefined8 *)(pkR + 0x18);
    register0x00001200 = ZEXT832(0) << 0x20;
    uStack_138 = CONCAT35(uStack_138._5_3_,0x20004d454b);
    builtin_memcpy(local_178,"HPKE",4);
    local_174 = 0x762d;
    local_172 = 0x31;
    local_171 = 0x4d454b;
    local_16d = 0x20;
    local_16c = (undefined1  [4])0x5f656165;
    auStack_168 = (undefined1  [3])0x6b7270;
    local_165 = auStack_78._0_5_;
    uStack_160 = auStack_78._5_3_;
    uStack_15d = auStack_78._8_5_;
    uStack_158 = auStack_78._13_4_;
    uStack_154 = auStack_78._17_2_;
    uStack_152 = auStack_78[0x13];
    uStack_151 = auStack_78._20_4_;
    uStack_14d = auStack_78._24_4_;
    uStack_149 = auStack_78._28_2_;
    auStack_147._0_2_ = auStack_78._30_2_;
    uStack_180 = 0x1ae891;
    uStack_17d = 0;
    Hacl_HKDF_extract_sha2_256(o_shared + 0x18,(uint8_t *)&uStack_138,0,local_178,0x33);
    local_1d8[0] = '\0';
    local_1d8[1] = ' ';
    local_1d6 = 0x454b5048;
    local_1d2 = 0x762d;
    local_1d0 = 0x31;
    local_1cf = (undefined4)uStack_138;
    local_1cb = uStack_138._4_1_;
    local_1ca = (undefined1  [5])0x6572616873;
    uStack_1c5._0_3_ = 0x735f64;
    uStack_1c5._3_5_ = 0x7465726365;
    uStack_185 = (undefined5)uVar8;
    uStack_180 = (undefined3)((ulong)uVar8 >> 0x28);
    uStack_1e0 = 0x1ae911;
    local_1bd = uVar1;
    uStack_1b5 = uVar2;
    uStack_1ad = uVar3;
    auStack_1a5 = (undefined1  [8])uVar4;
    local_19d = uVar5;
    uStack_195 = uVar6;
    uStack_18d = uVar7;
    Hacl_HKDF_expand_sha2_256(o_info_hash + 0x18,o_shared + 0x18,0x20,local_1d8,0x5b,0x20);
    local_40 = 0x1002000454b5048;
    stack0xffffffffffffff28 = ZEXT1632(ZEXT816(0));
    local_38 = 0x300;
    stack0xffffffffffffff08 = ZEXT1632(ZEXT816(0));
    uStack_158 = 0x454b5048;
    uStack_154 = 0x762d;
    uStack_152 = 0x31;
    uStack_151 = 0x454b5048;
    uStack_14d = 0x1002000;
    uStack_149 = 0x300;
    auStack_147._0_2_ = 0x7370;
    auStack_147._2_5_ = 0x5f64695f6b;
    stack0xfffffffffffffec0 = 0x68736168;
    uStack_160 = 0x1ae998;
    uStack_15d = 0;
    Hacl_HKDF_extract_sha2_256(o_shared + 0x18,(uint8_t *)&local_40,0,(uint8_t *)&uStack_158,0x1c);
    uStack_138 = 0;
    o_info_hash[0] = '\0';
    o_info_hash[1] = '\0';
    o_info_hash[2] = '\0';
    o_info_hash[3] = '\0';
    o_info_hash[4] = '\0';
    o_info_hash[5] = '\0';
    o_info_hash[6] = '\0';
    o_info_hash[7] = '\0';
    o_info_hash[8] = '\0';
    o_info_hash[9] = '\0';
    o_info_hash[10] = '\0';
    o_info_hash[0xb] = '\0';
    o_info_hash[0xc] = '\0';
    o_info_hash[0xd] = '\0';
    o_info_hash[0xe] = '\0';
    o_info_hash[0xf] = '\0';
    o_info_hash[0x10] = '\0';
    o_info_hash[0x11] = '\0';
    o_info_hash[0x12] = '\0';
    o_info_hash[0x13] = '\0';
    o_info_hash[0x14] = '\0';
    o_info_hash[0x15] = '\0';
    o_info_hash[0x16] = '\0';
    o_info_hash[0x17] = '\0';
    ikmlen = infolen + 0x1a;
    uVar14 = (ulong)ikmlen + 0xf & 0xfffffffffffffff0;
    lVar11 = -uVar14;
    puVar12 = (uint8_t *)((long)&uStack_158 + lVar11);
    *(undefined8 *)((long)&uStack_160 + lVar11) = 0x1ae9cc;
    memset(puVar12,0,(ulong)ikmlen);
    builtin_memcpy((uint8_t *)((long)&uStack_158 + lVar11),"HPKE",4);
    *(undefined2 *)((long)&uStack_154 + lVar11) = 0x762d;
    (&uStack_152)[lVar11] = 0x31;
    *(undefined8 *)((long)&uStack_151 + lVar11) = local_40;
    *(undefined2 *)((long)&uStack_149 + lVar11) = local_38;
    *(undefined8 *)(auStack_147 + lVar11) = 0x7361685f6f666e69;
    auStack_13f[-uVar14] = 0x68;
    uVar1 = o_dh._24_8_;
    *(undefined8 *)((long)&uStack_160 + lVar11) = 0x1aea25;
    memcpy(auStack_13f + lVar11 + 1,(void *)uVar1,(ulong)infolen);
    *(undefined8 *)((long)&uStack_160 + lVar11) = 0x1aea43;
    Hacl_HKDF_extract_sha2_256((uint8_t *)&uStack_138,(uint8_t *)&local_40,0,puVar12,ikmlen);
    uVar2 = o_shared._24_8_;
    uVar3 = o_eae_prk._0_8_;
    uVar4 = o_eae_prk._8_8_;
    uVar5 = o_eae_prk._16_8_;
    o_dh[0] = o_info_hash[0];
    o_dh[1] = o_info_hash[1];
    o_dh[2] = o_info_hash[2];
    o_dh[3] = o_info_hash[3];
    o_dh[4] = o_info_hash[4];
    o_dh[5] = o_info_hash[5];
    o_dh[6] = o_info_hash[6];
    o_dh[7] = o_info_hash[7];
    auStack_78 = (undefined1  [8])uStack_138;
    o_dh[8] = o_info_hash[8];
    o_dh[9] = o_info_hash[9];
    o_dh[10] = o_info_hash[10];
    o_dh[0xb] = o_info_hash[0xb];
    o_dh[0xc] = o_info_hash[0xc];
    o_dh[0xd] = o_info_hash[0xd];
    o_dh[0xe] = o_info_hash[0xe];
    o_dh[0xf] = o_info_hash[0xf];
    o_dh[0x10] = o_info_hash[0x10];
    o_dh[0x11] = o_info_hash[0x11];
    o_dh[0x12] = o_info_hash[0x12];
    o_dh[0x13] = o_info_hash[0x13];
    o_dh[0x14] = o_info_hash[0x14];
    o_dh[0x15] = o_info_hash[0x15];
    o_dh[0x16] = o_info_hash[0x16];
    o_dh[0x17] = o_info_hash[0x17];
    builtin_memcpy(local_178 + lVar11,"HPKE",4);
    *(undefined2 *)((long)&local_174 + lVar11) = 0x762d;
    (&local_172)[lVar11] = 0x31;
    *(undefined8 *)((long)&local_171 + lVar11) = local_40;
    *(undefined2 *)(auStack_168 + lVar11 + -1) = local_38;
    *(undefined4 *)(auStack_168 + lVar11 + 1) = 0x72636573;
    *(undefined2 *)(local_165 + lVar11 + 2) = 0x7465;
    *(undefined8 *)((long)&uStack_180 + lVar11) = 0x17;
    uVar1 = *(undefined8 *)((long)&uStack_180 + lVar11);
    prk = o_eae_prk + 0x18;
    *(undefined8 *)((long)&uStack_180 + lVar11) = 0x20;
    saltlen = (uint32_t)*(undefined8 *)((long)&uStack_180 + lVar11);
    *(undefined8 *)((long)&uStack_180 + lVar11) = 0x1aeac5;
    Hacl_HKDF_extract_sha2_256(prk,o_info_hash + 0x18,saltlen,local_178 + lVar11,(uint32_t)uVar1);
    (local_1d8 + lVar11)[0] = '\0';
    (local_1d8 + lVar11)[1] = ' ';
    *(undefined4 *)((long)&local_1d6 + lVar11) = 0x454b5048;
    *(undefined2 *)((long)&local_1d2 + lVar11) = 0x762d;
    (&local_1d0)[lVar11] = 0x31;
    *(undefined8 *)((long)&local_1cf + lVar11) = local_40;
    *(undefined2 *)(local_1ca + lVar11 + 3) = local_38;
    *(undefined4 *)((long)&uStack_1c5 + lVar11) = 0x707865;
    *(undefined8 *)((long)&uStack_1c5 + lVar11 + 4) = uVar2;
    *(undefined8 *)((long)&local_1bd + lVar11 + 4) = uVar3;
    *(undefined8 *)((long)&uStack_1b5 + lVar11 + 4) = uVar4;
    *(undefined8 *)((long)&uStack_1ad + lVar11 + 4) = uVar5;
    uVar1 = o_dh._0_8_;
    uVar6 = o_dh._8_8_;
    uVar7 = o_dh._16_8_;
    *(undefined1 (*) [8])(auStack_1a5 + lVar11 + 4) = auStack_78;
    *(undefined8 *)((long)&local_19d + lVar11 + 4) = uVar1;
    *(undefined8 *)((long)&uStack_195 + lVar11 + 4) = uVar6;
    *(undefined8 *)((long)&uStack_18d + lVar11 + 4) = uVar7;
    *(undefined8 *)((long)&uStack_1e0 + lVar11) = 0x57;
    infolen_00 = (uint32_t)*(undefined8 *)((long)&uStack_1e0 + lVar11);
    *(undefined8 *)((long)&uStack_1e0 + lVar11) = 0x1aeb36;
    Hacl_HKDF_expand_sha2_256(o_ctx.ctx_exporter,prk,saltlen,local_1d8 + lVar11,infolen_00,saltlen);
    (auStack_238 + lVar11)[0] = '\0';
    (auStack_238 + lVar11)[1] = ' ';
    puVar12 = auStack_238 + lVar11 + 2;
    puVar12[0] = 'H';
    puVar12[1] = 'P';
    puVar12[2] = 'K';
    puVar12[3] = 'E';
    *(undefined2 *)((long)&uStack_232 + lVar11) = 0x762d;
    (&uStack_230)[lVar11] = 0x31;
    *(undefined8 *)((long)&uStack_22f + lVar11) = local_40;
    *(undefined2 *)((long)&uStack_227 + lVar11) = local_38;
    puVar12 = auStack_221 + lVar11 + -4;
    puVar12[0] = 'k';
    puVar12[1] = 'e';
    puVar12[2] = 'y';
    puVar12[3] = '\0';
    *(undefined8 *)(auStack_221 + lVar11) = uVar2;
    *(undefined8 *)(auStack_219 + lVar11) = uVar3;
    *(undefined8 *)(auStack_211 + lVar11) = uVar4;
    *(undefined8 *)(auStack_209 + lVar11) = uVar5;
    uVar1 = o_dh._0_8_;
    uVar6 = o_dh._8_8_;
    uVar7 = o_dh._16_8_;
    *(undefined1 (*) [8])((long)&uStack_201 + lVar11) = auStack_78;
    *(undefined8 *)(auStack_1f9 + lVar11) = uVar1;
    *(undefined8 *)(auStack_1f1 + lVar11) = uVar6;
    *(undefined8 *)(auStack_1e9 + lVar11) = uVar7;
    puVar10 = auStack_242 + lVar11 + 2;
    puVar10[0] = 0xa8;
    puVar10[1] = 0xeb;
    puVar10[2] = '\x1a';
    puVar10[3] = '\0';
    puVar10[4] = '\0';
    puVar10[5] = '\0';
    puVar10[6] = '\0';
    puVar10[7] = '\0';
    Hacl_HKDF_expand_sha2_256(o_ctx.ctx_key,prk,saltlen,auStack_238 + lVar11,infolen_00,saltlen);
    (auStack_298 + lVar11)[0] = '\0';
    (auStack_298 + lVar11)[1] = '\f';
    puVar12 = auStack_298 + lVar11 + 2;
    puVar12[0] = 'H';
    puVar12[1] = 'P';
    puVar12[2] = 'K';
    puVar12[3] = 'E';
    *(undefined2 *)((long)&uStack_292 + lVar11) = 0x762d;
    (&uStack_290)[lVar11] = 0x31;
    *(undefined8 *)((long)&uStack_28f + lVar11) = local_40;
    *(undefined2 *)((long)&uStack_287 + lVar11) = local_38;
    *(undefined8 *)((long)&uStack_285 + lVar11) = 0x6e6f6e5f65736162;
    *(undefined2 *)((long)&uStack_27d + lVar11) = 0x6563;
    auStack_27b[lVar11] = '\0';
    *(undefined8 *)(auStack_27b + lVar11 + 1) = uVar2;
    *(undefined8 *)(auStack_272 + lVar11) = uVar3;
    *(undefined8 *)(auStack_26a + lVar11) = uVar4;
    *(undefined8 *)(auStack_262 + lVar11) = uVar5;
    uVar1 = o_dh._0_8_;
    uVar2 = o_dh._8_8_;
    uVar3 = o_dh._16_8_;
    *(undefined1 (*) [8])((long)&uStack_25a + lVar11) = auStack_78;
    *(undefined8 *)(auStack_252 + lVar11) = uVar1;
    *(undefined8 *)(auStack_24a + lVar11) = uVar2;
    *(undefined8 *)(auStack_242 + lVar11) = uVar3;
    *(undefined8 *)((long)&uStack_2a0 + lVar11) = 0x5e;
    uVar1 = *(undefined8 *)((long)&uStack_2a0 + lVar11);
    *(undefined8 *)((long)&uStack_2a0 + lVar11) = 0xc;
    uVar2 = *(undefined8 *)((long)&uStack_2a0 + lVar11);
    *(undefined8 *)((long)&uStack_2a0 + lVar11) = 0x1aec27;
    Hacl_HKDF_expand_sha2_256
              (o_ctx.ctx_nonce,prk,saltlen,auStack_298 + lVar11,(uint32_t)uVar1,(uint32_t)uVar2);
    *o_ctx.ctx_seq = 0;
  }
  return (uint)(bVar13 == 0xff);
}

Assistant:

uint32_t
Hacl_HPKE_Curve51_CP256_SHA256_setupBaseS(
  uint8_t *o_pkE,
  Hacl_Impl_HPKE_context_s o_ctx,
  uint8_t *skE,
  uint8_t *pkR,
  uint32_t infolen,
  uint8_t *info
)
{
  uint8_t o_shared[32U] = { 0U };
  uint8_t *o_pkE1 = o_pkE;
  Hacl_Curve25519_51_secret_to_public(o_pkE1, skE);
  uint32_t res1 = 0U;
  uint32_t res0;
  if (res1 == 0U)
  {
    uint8_t o_dh[32U] = { 0U };
    uint8_t zeros[32U] = { 0U };
    Hacl_Curve25519_51_scalarmult(o_dh, skE, pkR);
    uint8_t res2 = 255U;
    for (uint32_t i = 0U; i < 32U; i++)
    {
      uint8_t uu____0 = FStar_UInt8_eq_mask(o_dh[i], zeros[i]);
      res2 = (uint32_t)uu____0 & (uint32_t)res2;
    }
    uint8_t z = res2;
    uint32_t res;
    if (z == 255U)
    {
      res = 1U;
    }
    else
    {
      res = 0U;
    }
    uint32_t res20 = res;
    uint8_t o_kemcontext[64U] = { 0U };
    if (res20 == 0U)
    {
      memcpy(o_kemcontext, o_pkE, 32U * sizeof (uint8_t));
      uint8_t *o_pkRm = o_kemcontext + 32U;
      uint8_t *o_pkR = o_pkRm;
      memcpy(o_pkR, pkR, 32U * sizeof (uint8_t));
      uint8_t *o_dhm = o_dh;
      uint8_t o_eae_prk[32U] = { 0U };
      uint8_t suite_id_kem[5U] = { 0U };
      uint8_t *uu____1 = suite_id_kem;
      uu____1[0U] = 0x4bU;
      uu____1[1U] = 0x45U;
      uu____1[2U] = 0x4dU;
      uint8_t *uu____2 = suite_id_kem + 3U;
      uu____2[0U] = 0U;
      uu____2[1U] = 32U;
      uint8_t *empty = suite_id_kem;
      uint8_t label_eae_prk[7U] = { 0x65U, 0x61U, 0x65U, 0x5fU, 0x70U, 0x72U, 0x6bU };
      uint32_t len0 = 51U;
      KRML_CHECK_SIZE(sizeof (uint8_t), len0);
      uint8_t tmp0[len0];
      memset(tmp0, 0U, len0 * sizeof (uint8_t));
      uint8_t *uu____3 = tmp0;
      uu____3[0U] = 0x48U;
      uu____3[1U] = 0x50U;
      uu____3[2U] = 0x4bU;
      uu____3[3U] = 0x45U;
      uu____3[4U] = 0x2dU;
      uu____3[5U] = 0x76U;
      uu____3[6U] = 0x31U;
      memcpy(tmp0 + 7U, suite_id_kem, 5U * sizeof (uint8_t));
      memcpy(tmp0 + 12U, label_eae_prk, 7U * sizeof (uint8_t));
      memcpy(tmp0 + 19U, o_dhm, 32U * sizeof (uint8_t));
      Hacl_HKDF_extract_sha2_256(o_eae_prk, empty, 0U, tmp0, len0);
      uint8_t
      label_shared_secret[13U] =
        {
          0x73U, 0x68U, 0x61U, 0x72U, 0x65U, 0x64U, 0x5fU, 0x73U, 0x65U, 0x63U, 0x72U, 0x65U, 0x74U
        };
      uint32_t len = 91U;
      KRML_CHECK_SIZE(sizeof (uint8_t), len);
      uint8_t tmp[len];
      memset(tmp, 0U, len * sizeof (uint8_t));
      store16_be(tmp, (uint16_t)32U);
      uint8_t *uu____4 = tmp + 2U;
      uu____4[0U] = 0x48U;
      uu____4[1U] = 0x50U;
      uu____4[2U] = 0x4bU;
      uu____4[3U] = 0x45U;
      uu____4[4U] = 0x2dU;
      uu____4[5U] = 0x76U;
      uu____4[6U] = 0x31U;
      memcpy(tmp + 9U, suite_id_kem, 5U * sizeof (uint8_t));
      memcpy(tmp + 14U, label_shared_secret, 13U * sizeof (uint8_t));
      memcpy(tmp + 27U, o_kemcontext, 64U * sizeof (uint8_t));
      Hacl_HKDF_expand_sha2_256(o_shared, o_eae_prk, 32U, tmp, len, 32U);
      res0 = 0U;
    }
    else
    {
      res0 = 1U;
    }
  }
  else
  {
    res0 = 1U;
  }
  if (res0 == 0U)
  {
    uint8_t o_context[65U] = { 0U };
    uint8_t o_secret[32U] = { 0U };
    uint8_t suite_id[10U] = { 0U };
    uint8_t *uu____5 = suite_id;
    uu____5[0U] = 0x48U;
    uu____5[1U] = 0x50U;
    uu____5[2U] = 0x4bU;
    uu____5[3U] = 0x45U;
    uint8_t *uu____6 = suite_id + 4U;
    uu____6[0U] = 0U;
    uu____6[1U] = 32U;
    uint8_t *uu____7 = suite_id + 6U;
    uu____7[0U] = 0U;
    uu____7[1U] = 1U;
    uint8_t *uu____8 = suite_id + 8U;
    uu____8[0U] = 0U;
    uu____8[1U] = 3U;
    uint8_t
    label_psk_id_hash[11U] =
      { 0x70U, 0x73U, 0x6bU, 0x5fU, 0x69U, 0x64U, 0x5fU, 0x68U, 0x61U, 0x73U, 0x68U };
    uint8_t o_psk_id_hash[32U] = { 0U };
    uint8_t *empty = suite_id;
    uint32_t len0 = 28U;
    KRML_CHECK_SIZE(sizeof (uint8_t), len0);
    uint8_t tmp0[len0];
    memset(tmp0, 0U, len0 * sizeof (uint8_t));
    uint8_t *uu____9 = tmp0;
    uu____9[0U] = 0x48U;
    uu____9[1U] = 0x50U;
    uu____9[2U] = 0x4bU;
    uu____9[3U] = 0x45U;
    uu____9[4U] = 0x2dU;
    uu____9[5U] = 0x76U;
    uu____9[6U] = 0x31U;
    memcpy(tmp0 + 7U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp0 + 17U, label_psk_id_hash, 11U * sizeof (uint8_t));
    memcpy(tmp0 + 28U, empty, 0U * sizeof (uint8_t));
    Hacl_HKDF_extract_sha2_256(o_psk_id_hash, empty, 0U, tmp0, len0);
    uint8_t
    label_info_hash[9U] = { 0x69U, 0x6eU, 0x66U, 0x6fU, 0x5fU, 0x68U, 0x61U, 0x73U, 0x68U };
    uint8_t o_info_hash[32U] = { 0U };
    uint32_t len1 = 26U + infolen;
    KRML_CHECK_SIZE(sizeof (uint8_t), len1);
    uint8_t tmp1[len1];
    memset(tmp1, 0U, len1 * sizeof (uint8_t));
    uint8_t *uu____10 = tmp1;
    uu____10[0U] = 0x48U;
    uu____10[1U] = 0x50U;
    uu____10[2U] = 0x4bU;
    uu____10[3U] = 0x45U;
    uu____10[4U] = 0x2dU;
    uu____10[5U] = 0x76U;
    uu____10[6U] = 0x31U;
    memcpy(tmp1 + 7U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp1 + 17U, label_info_hash, 9U * sizeof (uint8_t));
    memcpy(tmp1 + 26U, info, infolen * sizeof (uint8_t));
    Hacl_HKDF_extract_sha2_256(o_info_hash, empty, 0U, tmp1, len1);
    o_context[0U] = 0U;
    memcpy(o_context + 1U, o_psk_id_hash, 32U * sizeof (uint8_t));
    memcpy(o_context + 33U, o_info_hash, 32U * sizeof (uint8_t));
    uint8_t label_secret[6U] = { 0x73U, 0x65U, 0x63U, 0x72U, 0x65U, 0x74U };
    uint32_t len2 = 23U;
    KRML_CHECK_SIZE(sizeof (uint8_t), len2);
    uint8_t tmp2[len2];
    memset(tmp2, 0U, len2 * sizeof (uint8_t));
    uint8_t *uu____11 = tmp2;
    uu____11[0U] = 0x48U;
    uu____11[1U] = 0x50U;
    uu____11[2U] = 0x4bU;
    uu____11[3U] = 0x45U;
    uu____11[4U] = 0x2dU;
    uu____11[5U] = 0x76U;
    uu____11[6U] = 0x31U;
    memcpy(tmp2 + 7U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp2 + 17U, label_secret, 6U * sizeof (uint8_t));
    memcpy(tmp2 + 23U, empty, 0U * sizeof (uint8_t));
    Hacl_HKDF_extract_sha2_256(o_secret, o_shared, 32U, tmp2, len2);
    uint8_t label_exp[3U] = { 0x65U, 0x78U, 0x70U };
    uint32_t len3 = 87U;
    KRML_CHECK_SIZE(sizeof (uint8_t), len3);
    uint8_t tmp3[len3];
    memset(tmp3, 0U, len3 * sizeof (uint8_t));
    store16_be(tmp3, (uint16_t)32U);
    uint8_t *uu____12 = tmp3 + 2U;
    uu____12[0U] = 0x48U;
    uu____12[1U] = 0x50U;
    uu____12[2U] = 0x4bU;
    uu____12[3U] = 0x45U;
    uu____12[4U] = 0x2dU;
    uu____12[5U] = 0x76U;
    uu____12[6U] = 0x31U;
    memcpy(tmp3 + 9U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp3 + 19U, label_exp, 3U * sizeof (uint8_t));
    memcpy(tmp3 + 22U, o_context, 65U * sizeof (uint8_t));
    Hacl_HKDF_expand_sha2_256(o_ctx.ctx_exporter, o_secret, 32U, tmp3, len3, 32U);
    uint8_t label_key[3U] = { 0x6bU, 0x65U, 0x79U };
    uint32_t len4 = 87U;
    KRML_CHECK_SIZE(sizeof (uint8_t), len4);
    uint8_t tmp4[len4];
    memset(tmp4, 0U, len4 * sizeof (uint8_t));
    store16_be(tmp4, (uint16_t)32U);
    uint8_t *uu____13 = tmp4 + 2U;
    uu____13[0U] = 0x48U;
    uu____13[1U] = 0x50U;
    uu____13[2U] = 0x4bU;
    uu____13[3U] = 0x45U;
    uu____13[4U] = 0x2dU;
    uu____13[5U] = 0x76U;
    uu____13[6U] = 0x31U;
    memcpy(tmp4 + 9U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp4 + 19U, label_key, 3U * sizeof (uint8_t));
    memcpy(tmp4 + 22U, o_context, 65U * sizeof (uint8_t));
    Hacl_HKDF_expand_sha2_256(o_ctx.ctx_key, o_secret, 32U, tmp4, len4, 32U);
    uint8_t
    label_base_nonce[10U] =
      { 0x62U, 0x61U, 0x73U, 0x65U, 0x5fU, 0x6eU, 0x6fU, 0x6eU, 0x63U, 0x65U };
    uint32_t len = 94U;
    KRML_CHECK_SIZE(sizeof (uint8_t), len);
    uint8_t tmp[len];
    memset(tmp, 0U, len * sizeof (uint8_t));
    store16_be(tmp, (uint16_t)12U);
    uint8_t *uu____14 = tmp + 2U;
    uu____14[0U] = 0x48U;
    uu____14[1U] = 0x50U;
    uu____14[2U] = 0x4bU;
    uu____14[3U] = 0x45U;
    uu____14[4U] = 0x2dU;
    uu____14[5U] = 0x76U;
    uu____14[6U] = 0x31U;
    memcpy(tmp + 9U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp + 19U, label_base_nonce, 10U * sizeof (uint8_t));
    memcpy(tmp + 29U, o_context, 65U * sizeof (uint8_t));
    Hacl_HKDF_expand_sha2_256(o_ctx.ctx_nonce, o_secret, 32U, tmp, len, 12U);
    o_ctx.ctx_seq[0U] = 0ULL;
    return res0;
  }
  return res0;
}